

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

String * __thiscall
nigel::Token_NumberL::toString_abi_cxx11_
          (String *__return_storage_ptr__,Token_NumberL *this,bool extended)

{
  char *__rhs;
  string local_40;
  byte local_19;
  Token_NumberL *pTStack_18;
  bool extended_local;
  Token_NumberL *this_local;
  
  local_19 = extended;
  pTStack_18 = this;
  this_local = (Token_NumberL *)__return_storage_ptr__;
  std::__cxx11::to_string(&local_40,this->number);
  __rhs = "";
  if ((local_19 & 1) != 0) {
    __rhs = "\t\tas number literal";
  }
  std::operator+(__return_storage_ptr__,&local_40,__rhs);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

String Token_NumberL::toString( bool extended ) const
	{
		return to_string( number ) + ( extended ? "\t\tas number literal" : "" );
	}